

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout.cpp
# Opt level: O2

int __thiscall ncnn::Dropout::forward_inplace(Dropout *this,Mat *bottom_top_blob)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int c;
  Mat local_60;
  
  if (this->scale != 1.0) {
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar2;
    }
    iVar3 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar3 = 0;
    }
    while (c = (int)uVar2, c != iVar3) {
      Mat::channel(&local_60,bottom_top_blob,c);
      pvVar1 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
        *(float *)((long)pvVar1 + uVar2 * 4) = this->scale * *(float *)((long)pvVar1 + uVar2 * 4);
      }
      uVar2 = (ulong)(c + 1);
    }
  }
  return 0;
}

Assistant:

int Dropout::forward_inplace(Mat& bottom_top_blob) const
{
    if (scale == 1.f)
    {
        return 0;
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * scale;
        }
    }

    return 0;
}